

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O0

ROMImage * MT32Emu::ROMImage::appendImages(ROMImage *romImageLow,ROMImage *romImageHigh)

{
  int iVar1;
  int iVar2;
  int iVar3;
  File *pFVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Bit8u *data_00;
  ROMInfo *pRVar5;
  ROMImage *romImageFull;
  Bit8u *data;
  size_t partSize;
  Bit8u *romDataHigh;
  Bit8u *romDataLow;
  ROMImage *romImageHigh_local;
  ROMImage *romImageLow_local;
  size_t __n;
  
  pFVar4 = getFile(romImageLow);
  iVar1 = (*pFVar4->_vptr_File[3])();
  pFVar4 = getFile(romImageHigh);
  iVar2 = (*pFVar4->_vptr_File[3])();
  pFVar4 = getFile(romImageLow);
  iVar3 = (*pFVar4->_vptr_File[2])();
  __n = CONCAT44(extraout_var_01,iVar3);
  data_00 = (Bit8u *)operator_new__(__n << 1);
  memcpy(data_00,(void *)CONCAT44(extraout_var,iVar1),__n);
  memcpy(data_00 + __n,(void *)CONCAT44(extraout_var_00,iVar2),__n);
  romImageLow_local = makeFullROMImage(data_00,__n << 1);
  pRVar5 = getROMInfo(romImageLow_local);
  if (pRVar5 == (ROMInfo *)0x0) {
    freeROMImage(romImageLow_local);
    romImageLow_local = (ROMImage *)0x0;
  }
  return romImageLow_local;
}

Assistant:

const ROMImage *ROMImage::appendImages(const ROMImage *romImageLow, const ROMImage *romImageHigh) {
	const Bit8u *romDataLow = romImageLow->getFile()->getData();
	const Bit8u *romDataHigh = romImageHigh->getFile()->getData();
	size_t partSize = romImageLow->getFile()->getSize();
	Bit8u *data = new Bit8u[2 * partSize];
	memcpy(data, romDataLow, partSize);
	memcpy(data + partSize, romDataHigh, partSize);
	const ROMImage *romImageFull = makeFullROMImage(data, 2 * partSize);
	if (romImageFull->getROMInfo() == NULL) {
		freeROMImage(romImageFull);
		return NULL;
	}
	return romImageFull;
}